

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csharp_helpers.cc
# Opt level: O0

string * google::protobuf::compiler::csharp::GetOutputFile
                   (string *__return_storage_ptr__,FileDescriptor *descriptor,string *file_extension
                   ,bool generate_directories,string *base_namespace,string *error)

{
  bool bVar1;
  ulong uVar2;
  long lVar3;
  FileDescriptor *descriptor_00;
  allocator local_219;
  string local_218;
  allocator local_1f1;
  string local_1f0;
  undefined1 local_1d0 [8];
  string namespace_dir;
  string local_190 [39];
  allocator local_169;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_168;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_148;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_128;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108;
  undefined1 local_e8 [8];
  string extended_ns;
  string namespace_suffix;
  string ns;
  string local_78;
  undefined1 local_58 [8];
  string relative_filename;
  string *error_local;
  string *base_namespace_local;
  bool generate_directories_local;
  string *file_extension_local;
  FileDescriptor *descriptor_local;
  
  relative_filename.field_2._8_8_ = error;
  GetFileNameBase_abi_cxx11_(&local_78,(csharp *)descriptor,(FileDescriptor *)file_extension);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58,
                 &local_78,file_extension);
  std::__cxx11::string::~string((string *)&local_78);
  if (!generate_directories) {
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)local_58);
    goto LAB_0037d003;
  }
  GetFileNamespace_abi_cxx11_
            ((string *)((long)&namespace_suffix.field_2 + 8),(csharp *)descriptor,descriptor_00);
  std::__cxx11::string::string
            ((string *)(extended_ns.field_2._M_local_buf + 8),
             (string *)(namespace_suffix.field_2._M_local_buf + 8));
  uVar2 = std::__cxx11::string::empty();
  if ((uVar2 & 1) == 0) {
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_e8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&namespace_suffix.field_2 + 8),".");
    std::operator+(&local_108,base_namespace,".");
    lVar3 = std::__cxx11::string::find((string *)local_e8,(ulong)&local_108);
    std::__cxx11::string::~string((string *)&local_108);
    if (lVar3 == 0) {
      std::__cxx11::string::length();
      std::__cxx11::string::substr((ulong)local_190,(ulong)((long)&namespace_suffix.field_2 + 8));
      std::__cxx11::string::operator=((string *)(extended_ns.field_2._M_local_buf + 8),local_190);
      std::__cxx11::string::~string(local_190);
      lVar3 = std::__cxx11::string::find(extended_ns.field_2._M_local_buf + 8,0x5dcadc);
      if (lVar3 == 0) {
        std::__cxx11::string::substr
                  ((ulong)((long)&namespace_dir.field_2 + 8),(ulong)((long)&extended_ns.field_2 + 8)
                  );
        std::__cxx11::string::operator=
                  ((string *)(extended_ns.field_2._M_local_buf + 8),
                   (string *)(namespace_dir.field_2._M_local_buf + 8));
        std::__cxx11::string::~string((string *)(namespace_dir.field_2._M_local_buf + 8));
      }
      bVar1 = false;
    }
    else {
      std::operator+(&local_168,"Namespace ",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&namespace_suffix.field_2 + 8));
      std::operator+(&local_148,&local_168," is not a prefix namespace of base namespace ");
      std::operator+(&local_128,&local_148,base_namespace);
      std::__cxx11::string::operator=
                ((string *)relative_filename.field_2._8_8_,(string *)&local_128);
      std::__cxx11::string::~string((string *)&local_128);
      std::__cxx11::string::~string((string *)&local_148);
      std::__cxx11::string::~string((string *)&local_168);
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)__return_storage_ptr__,"",&local_169);
      std::allocator<char>::~allocator((allocator<char> *)&local_169);
      bVar1 = true;
    }
    std::__cxx11::string::~string((string *)local_e8);
    if (!bVar1) goto LAB_0037ce4d;
  }
  else {
LAB_0037ce4d:
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_1f0,".",&local_1f1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_218,"/",&local_219);
    StringReplace((string *)local_1d0,(string *)((long)&extended_ns.field_2 + 8),&local_1f0,
                  &local_218,true);
    std::__cxx11::string::~string((string *)&local_218);
    std::allocator<char>::~allocator((allocator<char> *)&local_219);
    std::__cxx11::string::~string((string *)&local_1f0);
    std::allocator<char>::~allocator((allocator<char> *)&local_1f1);
    uVar2 = std::__cxx11::string::empty();
    if ((uVar2 & 1) == 0) {
      std::__cxx11::string::operator+=((string *)local_1d0,"/");
    }
    std::operator+(__return_storage_ptr__,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1d0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58);
    std::__cxx11::string::~string((string *)local_1d0);
  }
  std::__cxx11::string::~string((string *)(extended_ns.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)(namespace_suffix.field_2._M_local_buf + 8));
LAB_0037d003:
  std::__cxx11::string::~string((string *)local_58);
  return __return_storage_ptr__;
}

Assistant:

std::string GetOutputFile(
    const google::protobuf::FileDescriptor* descriptor,
    const std::string file_extension,
    const bool generate_directories,
    const std::string base_namespace,
    string* error) {
  string relative_filename = GetFileNameBase(descriptor) + file_extension;
  if (!generate_directories) {
    return relative_filename;
  }
  string ns = GetFileNamespace(descriptor);
  string namespace_suffix = ns;
  if (!base_namespace.empty()) {
    // Check that the base_namespace is either equal to or a leading part of
    // the file namespace. This isn't just a simple prefix; "Foo.B" shouldn't
    // be regarded as a prefix of "Foo.Bar". The simplest option is to add "."
    // to both.
    string extended_ns = ns + ".";
    if (extended_ns.find(base_namespace + ".") != 0) {
      *error = "Namespace " + ns + " is not a prefix namespace of base namespace " + base_namespace;
      return ""; // This will be ignored, because we've set an error.
    }
    namespace_suffix = ns.substr(base_namespace.length());
    if (namespace_suffix.find(".") == 0) {
      namespace_suffix = namespace_suffix.substr(1);
    }
  }

  string namespace_dir = StringReplace(namespace_suffix, ".", "/", true);
  if (!namespace_dir.empty()) {
    namespace_dir += "/";
  }
  return namespace_dir + relative_filename;
}